

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

SequenceConcatExpr * __thiscall
slang::BumpAllocator::
emplace<slang::ast::SequenceConcatExpr,std::span<slang::ast::SequenceConcatExpr::Element,18446744073709551615ul>>
          (BumpAllocator *this,
          span<slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL> *args)

{
  span<const_slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL> elements;
  SequenceConcatExpr *pSVar1;
  __extent_storage<18446744073709551615UL> in_RSI;
  BumpAllocator *in_RDI;
  SequenceConcatExpr *in_stack_ffffffffffffffe0;
  pointer in_stack_ffffffffffffffe8;
  
  pSVar1 = (SequenceConcatExpr *)
           allocate(in_RDI,in_RSI._M_extent_value,(size_t)in_stack_ffffffffffffffe8);
  std::span<const_slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL>::
  span<slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL>
            ((span<const_slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL> *)
             in_RSI._M_extent_value,
             (span<slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL> *)
             in_stack_ffffffffffffffe8);
  elements._M_extent._M_extent_value = in_RSI._M_extent_value;
  elements._M_ptr = in_stack_ffffffffffffffe8;
  slang::ast::SequenceConcatExpr::SequenceConcatExpr(in_stack_ffffffffffffffe0,elements);
  return pSVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }